

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O2

_Bool Curl_conn_is_multiplex(connectdata *conn,int sockindex)

{
  uint uVar1;
  Curl_cfilter *pCVar2;
  Curl_cfilter **ppCVar3;
  
  if (conn == (connectdata *)0x0) {
    pCVar2 = (Curl_cfilter *)0x0;
    goto LAB_00118804;
  }
  ppCVar3 = conn->cfilter + sockindex;
  while( true ) {
    pCVar2 = *ppCVar3;
LAB_00118804:
    if (pCVar2 == (Curl_cfilter *)0x0) {
      return false;
    }
    uVar1 = pCVar2->cft->flags;
    if ((uVar1 & 4) != 0) {
      return true;
    }
    if ((uVar1 & 3) != 0) break;
    ppCVar3 = &pCVar2->next;
  }
  return false;
}

Assistant:

bool Curl_conn_is_multiplex(struct connectdata *conn, int sockindex)
{
  struct Curl_cfilter *cf = conn ? conn->cfilter[sockindex] : NULL;

  for(; cf; cf = cf->next) {
    if(cf->cft->flags & CF_TYPE_MULTIPLEX)
      return TRUE;
    if(cf->cft->flags & (CF_TYPE_IP_CONNECT|CF_TYPE_SSL))
      return FALSE;
  }
  return FALSE;
}